

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_storage.cpp
# Opt level: O3

void __thiscall
cppcms::impl::mem_cache<cppcms::impl::thread_settings>::nl_clear
          (mem_cache<cppcms::impl::thread_settings> *this)

{
  pointer_list_type *ppVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  
  std::
  _Rb_tree<long,_std::pair<const_long,_cppcms::impl::hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>_>_>::iterator>,_std::_Select1st<std::pair<const_long,_cppcms::impl::hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>_>_>::iterator>_>,_std::less<long>,_std::allocator<std::pair<const_long,_cppcms::impl::hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>_>_>::iterator>_>_>
  ::clear(&(this->timeout)._M_t);
  ppVar1 = &this->lru;
  p_Var3 = (this->lru).
           super__List_base<cppcms::impl::hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>_>_>::iterator,_std::allocator<cppcms::impl::hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>_>_>::iterator>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  while (p_Var3 != (_List_node_base *)ppVar1) {
    p_Var2 = p_Var3->_M_next;
    operator_delete(p_Var3);
    p_Var3 = p_Var2;
  }
  (this->lru).
  super__List_base<cppcms::impl::hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>_>_>::iterator,_std::allocator<cppcms::impl::hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>_>_>::iterator>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)ppVar1;
  (this->lru).
  super__List_base<cppcms::impl::hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>_>_>::iterator,_std::allocator<cppcms::impl::hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>_>_>::iterator>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)ppVar1;
  (this->lru).
  super__List_base<cppcms::impl::hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>_>_>::iterator,_std::allocator<cppcms::impl::hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>_>_>::iterator>_>
  ._M_impl._M_node._M_size = 0;
  details::
  basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>_>_>
  ::clear(&(this->primary).impl_);
  details::
  basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>_>_>
  ::rehash(&(this->primary).impl_,(ulong)this->limit);
  details::basic_map<$7159f324$>::clear(&(this->triggers).impl_);
  details::basic_map<$7159f324$>::rehash(&(this->triggers).impl_,(ulong)this->limit);
  this->size = 0;
  this->triggers_count = 0;
  return;
}

Assistant:

void nl_clear()
	{
		timeout.clear();
		lru.clear();
		primary.clear();
		primary.rehash(limit);
		triggers.clear();
		triggers.rehash(limit);
		size = 0;
		triggers_count = 0;
	}